

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.h
# Opt level: O1

int Fantasy_Movie_verify_table(flatcc_table_verifier_descriptor_t *td)

{
  int iVar1;
  
  iVar1 = flatcc_verify_union_field(td,1,0,Fantasy_Character_union_verifier);
  if (iVar1 == 0) {
    iVar1 = flatcc_verify_union_field(td,3,0,Fantasy_Character_union_verifier);
    if (iVar1 == 0) {
      iVar1 = flatcc_verify_union_field(td,5,0,Fantasy_Character_union_verifier);
      if (iVar1 == 0) {
        iVar1 = flatcc_verify_union_field(td,7,0,Fantasy_Character_union_verifier);
        if (iVar1 == 0) {
          iVar1 = flatcc_verify_union_vector_field(td,9,0,Fantasy_Character_union_verifier);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int Fantasy_Movie_verify_table(flatcc_table_verifier_descriptor_t *td)
{
    int ret;
    if ((ret = flatcc_verify_union_field(td, 1, 0, &Fantasy_Character_union_verifier) /* main_character */)) return ret;
    if ((ret = flatcc_verify_union_field(td, 3, 0, &Fantasy_Character_union_verifier) /* antagonist */)) return ret;
    if ((ret = flatcc_verify_union_field(td, 5, 0, &Fantasy_Character_union_verifier) /* side_kick */)) return ret;
    if ((ret = flatcc_verify_union_field(td, 7, 0, &Fantasy_Character_union_verifier) /* cameo */)) return ret;
    if ((ret = flatcc_verify_union_vector_field(td, 9, 0, &Fantasy_Character_union_verifier) /* characters */)) return ret;
    return flatcc_verify_ok;
}